

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int singlematch(int c,char *p,char *ep)

{
  char cVar1;
  char *ep_local;
  char *p_local;
  int c_local;
  
  cVar1 = *p;
  if (cVar1 == '%') {
    p_local._4_4_ = match_class(c,(uint)(byte)p[1]);
  }
  else if (cVar1 == '.') {
    p_local._4_4_ = 1;
  }
  else if (cVar1 == '[') {
    p_local._4_4_ = matchbracketclass(c,p,ep + -1);
  }
  else {
    p_local._4_4_ = (uint)((uint)(byte)*p == c);
  }
  return p_local._4_4_;
}

Assistant:

static int singlematch(int c, const char *p, const char *ep)
{
  switch (*p) {
  case '.': return 1;  /* matches any char */
  case L_ESC: return match_class(c, uchar(*(p+1)));
  case '[': return matchbracketclass(c, p, ep-1);
  default:  return (uchar(*p) == c);
  }
}